

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O0

char * utostr(uint64_t X,_Bool isNeg)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  byte in_SIL;
  ulong in_RDI;
  char *result;
  char *BufPtr;
  char Buffer [22];
  undefined1 *local_30;
  char *in_stack_ffffffffffffffd8;
  undefined1 local_14;
  undefined1 local_13 [10];
  byte local_9;
  ulong local_8;
  
  local_9 = in_SIL & 1;
  local_30 = local_13;
  local_13[0] = 0;
  local_8 = in_RDI;
  if (in_RDI == 0) {
    local_30 = &local_14;
    local_14 = 0x30;
  }
  for (; local_8 != 0; local_8 = local_8 / 10) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_8;
    local_30[-1] = SUB161(auVar1 % ZEXT816(10),0) + '0';
    local_30 = local_30 + -1;
  }
  if (local_9 != 0) {
    local_30[-1] = 0x2d;
  }
  pcVar2 = cs_strdup(in_stack_ffffffffffffffd8);
  return pcVar2;
}

Assistant:

static char *utostr(uint64_t X, bool isNeg)
{
	char Buffer[22];
	char *BufPtr = Buffer+21;
	char *result;

	Buffer[21] = '\0';
	if (X == 0) *--BufPtr = '0';  // Handle special case...

	while (X) {
		*--BufPtr = X % 10 + '0';
		X /= 10;
	}

	if (isNeg) *--BufPtr = '-';   // Add negative sign...

	result = cs_strdup(BufPtr);
	return result;
}